

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::write_activated(session_base_t *this,pipe_t *pipe_)

{
  size_type sVar1;
  key_type in_RSI;
  key_type *in_RDI;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *unaff_retaddr;
  
  if (in_RDI[0xb1] == in_RSI) {
    if (in_RDI[0xba] != (key_type)0x0) {
      (*(in_RDI[0xba]->super_object_t)._vptr_object_t[5])();
    }
  }
  else {
    sVar1 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::count
                      (unaff_retaddr,in_RDI);
    if (sVar1 != 1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_terminating_pipes.count (pipe_) == 1",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x148);
      fflush(_stderr);
      zmq_abort((char *)0x303382);
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::write_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (_pipe != pipe_) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (_engine)
        _engine->restart_input ();
}